

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

AREA_AFFECT_DATA * new_affect_area(void)

{
  AREA_AFFECT_DATA *af;
  AREA_AFFECT_DATA *local_8;
  
  if (aaffect_free == (AREA_AFFECT_DATA *)0x0) {
    local_8 = (AREA_AFFECT_DATA *)operator_new(0x50);
  }
  else {
    local_8 = aaffect_free;
    aaffect_free = aaffect_free->next;
  }
  memcpy(local_8,&new_affect_area::af_zero,0x50);
  local_8->valid = true;
  return local_8;
}

Assistant:

AREA_AFFECT_DATA *new_affect_area(void)
{
	static AREA_AFFECT_DATA af_zero;
	AREA_AFFECT_DATA *af;

	if (aaffect_free == nullptr)
	{
		af = new AREA_AFFECT_DATA;
	}
	else
	{
		af = aaffect_free;
		aaffect_free = aaffect_free->next;
	}

	*af = af_zero;

	af->valid = true;
	return af;
}